

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts pick_nan_muladd(FloatParts a,FloatParts b,FloatParts c,_Bool inf_zero,float_status *s)

{
  undefined4 uVar1;
  _Bool _Var2;
  FloatParts FVar3;
  int local_50;
  int which;
  _Bool inf_zero_local;
  FloatParts c_local;
  FloatParts b_local;
  FloatParts a_local;
  undefined8 local_10;
  
  b_local._8_8_ = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_4_ = a._12_4_;
  uVar1 = a_local.frac._4_4_;
  a_local.frac._4_1_ = a.cls;
  _Var2 = is_snan(a_local.frac._4_1_);
  b_local.frac._4_1_ = b.cls;
  c_local.frac._4_1_ = c.cls;
  if (((_Var2) || (_Var2 = is_snan(b_local.frac._4_1_), _Var2)) ||
     (_Var2 = is_snan(c_local.frac._4_1_), _Var2)) {
    s->float_exception_flags = s->float_exception_flags | 1;
  }
  local_50 = pickNaNMulAdd(a_local.frac._4_1_,b_local.frac._4_1_,c_local.frac._4_1_,inf_zero,s);
  if (s->default_nan_mode != '\0') {
    local_50 = 3;
  }
  switch(local_50) {
  case 0:
    a_local.frac._4_4_ = uVar1;
    break;
  case 1:
    a_local.frac._0_4_ = b.exp;
    a_local.frac._4_4_ = b._12_4_;
    b_local._8_8_ = b.frac;
    break;
  case 2:
    a_local.frac._0_4_ = c.exp;
    a_local.frac._4_4_ = c._12_4_;
    b_local._8_8_ = c.frac;
    break;
  case 3:
    FVar3 = parts_default_nan(s);
    return FVar3;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
               ,0x3c7,(char *)0x0);
  }
  _Var2 = is_snan(a_local.frac._4_1_);
  if (_Var2) {
    FVar3.exp = (int32_t)a_local.frac;
    FVar3.frac._0_4_ = b_local.exp;
    FVar3.frac._4_1_ = b_local.cls;
    FVar3.frac._5_1_ = b_local.sign;
    FVar3.frac._6_2_ = b_local._14_2_;
    FVar3.cls = a_local.frac._4_1_;
    FVar3.sign = (_Bool)a_local.frac._5_1_;
    FVar3._14_2_ = a_local.frac._6_2_;
    join_0x00000010_0x00000000_ = parts_silence_nan(FVar3,s);
  }
  else {
    local_10._4_1_ = a_local.frac._4_1_;
    local_10._5_1_ = (_Bool)a_local.frac._5_1_;
    local_10._6_2_ = a_local.frac._6_2_;
    local_10._0_4_ = (int32_t)a_local.frac;
    a_local.exp = b_local.exp;
    a_local.cls = b_local.cls;
    a_local.sign = b_local.sign;
    a_local._14_2_ = b_local._14_2_;
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts pick_nan_muladd(FloatParts a, FloatParts b, FloatParts c,
                                  bool inf_zero, float_status *s)
{
    int which;

    if (is_snan(a.cls) || is_snan(b.cls) || is_snan(c.cls)) {
        s->float_exception_flags |= float_flag_invalid;
    }

    which = pickNaNMulAdd(a.cls, b.cls, c.cls, inf_zero, s);

    if (s->default_nan_mode) {
        /* Note that this check is after pickNaNMulAdd so that function
         * has an opportunity to set the Invalid flag.
         */
        which = 3;
    }

    switch (which) {
    case 0:
        break;
    case 1:
        a = b;
        break;
    case 2:
        a = c;
        break;
    case 3:
        return parts_default_nan(s);
    default:
        g_assert_not_reached();
        break;
    }

    if (is_snan(a.cls)) {
        return parts_silence_nan(a, s);
    }
    return a;
}